

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::ConstDefinition> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::ConstDefinition>(RecursiveDescentParser *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::ConstDefinition> sVar2;
  undefined1 local_78 [24];
  string local_60 [48];
  undefined1 local_30 [32];
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::ConstDefinition> *pResult;
  
  local_30[0x17] = 0;
  this_local = this;
  std::make_shared<MyCompiler::ConstDefinition>();
  parse<MyCompiler::Ident>((RecursiveDescentParser *)local_30);
  peVar1 = std::
           __shared_ptr_access<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<MyCompiler::Ident>::operator=
            (&peVar1->pIdent,(shared_ptr<MyCompiler::Ident> *)local_30);
  std::shared_ptr<MyCompiler::Ident>::~shared_ptr((shared_ptr<MyCompiler::Ident> *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,"identifier must be followed by =",(allocator *)(local_78 + 0x17));
  except(in_RSI,EQL,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)(local_78 + 0x17));
  parse<MyCompiler::Number>((RecursiveDescentParser *)local_78);
  peVar1 = std::
           __shared_ptr_access<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<MyCompiler::Number>::operator=
            (&peVar1->pNumber,(shared_ptr<MyCompiler::Number> *)local_78);
  std::shared_ptr<MyCompiler::Number>::~shared_ptr((shared_ptr<MyCompiler::Number> *)local_78);
  sVar2.super___shared_ptr<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::ConstDefinition>)
         sVar2.super___shared_ptr<MyCompiler::ConstDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::ConstDefinition> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<ConstDefinition>();

    pResult->pIdent = parse<Ident>();
    except(SymbolType::EQL, "identifier must be followed by =");
    pResult->pNumber = parse<Number>();

    return pResult;
}